

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O0

void png_set_keep_unknown_chunks
               (png_structrp png_ptr,int keep,png_const_bytep chunk_list,int num_chunks_in)

{
  uint local_4c;
  png_bytep ppStack_48;
  uint i;
  png_bytep outlist;
  png_const_bytep inlist;
  uint old_num_chunks;
  uint num_chunks;
  png_bytep new_list;
  png_byte *ppStack_20;
  int num_chunks_in_local;
  png_const_bytep chunk_list_local;
  int keep_local;
  png_structrp png_ptr_local;
  
  if (png_ptr != (png_structrp)0x0) {
    if ((keep < 0) || (3 < keep)) {
      png_app_error(png_ptr,"png_set_keep_unknown_chunks: invalid keep");
    }
    else if ((0 < num_chunks_in) || (png_ptr->unknown_default = keep, num_chunks_in != 0)) {
      if (num_chunks_in < 0) {
        ppStack_20 = "bKGD";
        inlist._4_4_ = 0x12;
      }
      else {
        inlist._4_4_ = num_chunks_in;
        ppStack_20 = chunk_list;
        if (chunk_list == (png_const_bytep)0x0) {
          png_app_error(png_ptr,"png_set_keep_unknown_chunks: no chunk list");
          return;
        }
      }
      inlist._0_4_ = png_ptr->num_chunk_list;
      if (png_ptr->chunk_list == (png_bytep)0x0) {
        inlist._0_4_ = 0;
      }
      if (inlist._4_4_ + (uint)inlist < 0x33333334) {
        if (keep == 0) {
          if ((uint)inlist == 0) {
            _old_num_chunks = (png_bytep)0x0;
          }
          else {
            _old_num_chunks = png_ptr->chunk_list;
          }
        }
        else {
          _old_num_chunks =
               (png_bytep)png_malloc(png_ptr,(ulong)((inlist._4_4_ + (uint)inlist) * 5));
          if ((uint)inlist != 0) {
            memcpy(_old_num_chunks,png_ptr->chunk_list,(ulong)((uint)inlist * 5));
          }
        }
        if (_old_num_chunks == (png_bytep)0x0) {
          inlist._4_4_ = 0;
        }
        else {
          for (local_4c = 0; local_4c < inlist._4_4_; local_4c = local_4c + 1) {
            inlist._0_4_ = add_one_chunk(_old_num_chunks,(uint)inlist,ppStack_20 + local_4c * 5,keep
                                        );
          }
          inlist._4_4_ = 0;
          ppStack_48 = _old_num_chunks;
          outlist = _old_num_chunks;
          for (local_4c = 0; local_4c < (uint)inlist; local_4c = local_4c + 1) {
            if (outlist[4] != '\0') {
              if (ppStack_48 != outlist) {
                *(undefined4 *)ppStack_48 = *(undefined4 *)outlist;
                ppStack_48[4] = outlist[4];
              }
              ppStack_48 = ppStack_48 + 5;
              inlist._4_4_ = inlist._4_4_ + 1;
            }
            outlist = outlist + 5;
          }
          if (inlist._4_4_ == 0) {
            if (png_ptr->chunk_list != _old_num_chunks) {
              png_free(png_ptr,_old_num_chunks);
            }
            _old_num_chunks = (png_bytep)0x0;
          }
        }
        png_ptr->num_chunk_list = inlist._4_4_;
        if (png_ptr->chunk_list != _old_num_chunks) {
          if (png_ptr->chunk_list != (png_bytep)0x0) {
            png_free(png_ptr,png_ptr->chunk_list);
          }
          png_ptr->chunk_list = _old_num_chunks;
        }
      }
      else {
        png_app_error(png_ptr,"png_set_keep_unknown_chunks: too many chunks");
      }
    }
  }
  return;
}

Assistant:

void PNGAPI
png_set_keep_unknown_chunks(png_structrp png_ptr, int keep,
    png_const_bytep chunk_list, int num_chunks_in)
{
   png_bytep new_list;
   unsigned int num_chunks, old_num_chunks;

   if (png_ptr == NULL)
      return;

   if (keep < 0 || keep >= PNG_HANDLE_CHUNK_LAST)
   {
      png_app_error(png_ptr, "png_set_keep_unknown_chunks: invalid keep");

      return;
   }

   if (num_chunks_in <= 0)
   {
      png_ptr->unknown_default = keep;

      /* '0' means just set the flags, so stop here */
      if (num_chunks_in == 0)
        return;
   }

   if (num_chunks_in < 0)
   {
      /* Ignore all unknown chunks and all chunks recognized by
       * libpng except for IHDR, PLTE, tRNS, IDAT, and IEND
       */
      static PNG_CONST png_byte chunks_to_ignore[] = {
         98,  75,  71,  68, '\0',  /* bKGD */
         99,  72,  82,  77, '\0',  /* cHRM */
        101,  88,  73, 102, '\0',  /* eXIf */
        103,  65,  77,  65, '\0',  /* gAMA */
        104,  73,  83,  84, '\0',  /* hIST */
        105,  67,  67,  80, '\0',  /* iCCP */
        105,  84,  88, 116, '\0',  /* iTXt */
        111,  70,  70, 115, '\0',  /* oFFs */
        112,  67,  65,  76, '\0',  /* pCAL */
        112,  72,  89, 115, '\0',  /* pHYs */
        115,  66,  73,  84, '\0',  /* sBIT */
        115,  67,  65,  76, '\0',  /* sCAL */
        115,  80,  76,  84, '\0',  /* sPLT */
        115,  84,  69,  82, '\0',  /* sTER */
        115,  82,  71,  66, '\0',  /* sRGB */
        116,  69,  88, 116, '\0',  /* tEXt */
        116,  73,  77,  69, '\0',  /* tIME */
        122,  84,  88, 116, '\0'   /* zTXt */
      };

      chunk_list = chunks_to_ignore;
      num_chunks = (unsigned int)/*SAFE*/(sizeof chunks_to_ignore)/5U;
   }

   else /* num_chunks_in > 0 */
   {
      if (chunk_list == NULL)
      {
         /* Prior to 1.6.0 this was silently ignored, now it is an app_error
          * which can be switched off.
          */
         png_app_error(png_ptr, "png_set_keep_unknown_chunks: no chunk list");

         return;
      }

      num_chunks = (unsigned int)num_chunks_in;
   }

   old_num_chunks = png_ptr->num_chunk_list;
   if (png_ptr->chunk_list == NULL)
      old_num_chunks = 0;

   /* Since num_chunks is always restricted to UINT_MAX/5 this can't overflow.
    */
   if (num_chunks + old_num_chunks > UINT_MAX/5)
   {
      png_app_error(png_ptr, "png_set_keep_unknown_chunks: too many chunks");

      return;
   }

   /* If these chunks are being reset to the default then no more memory is
    * required because add_one_chunk above doesn't extend the list if the 'keep'
    * parameter is the default.
    */
   if (keep != 0)
   {
      new_list = png_voidcast(png_bytep, png_malloc(png_ptr,
          5 * (num_chunks + old_num_chunks)));

      if (old_num_chunks > 0)
         memcpy(new_list, png_ptr->chunk_list, 5*old_num_chunks);
   }

   else if (old_num_chunks > 0)
      new_list = png_ptr->chunk_list;

   else
      new_list = NULL;

   /* Add the new chunks together with each one's handling code.  If the chunk
    * already exists the code is updated, otherwise the chunk is added to the
    * end.  (In libpng 1.6.0 order no longer matters because this code enforces
    * the earlier convention that the last setting is the one that is used.)
    */
   if (new_list != NULL)
   {
      png_const_bytep inlist;
      png_bytep outlist;
      unsigned int i;

      for (i=0; i<num_chunks; ++i)
      {
         old_num_chunks = add_one_chunk(new_list, old_num_chunks,
             chunk_list+5*i, keep);
      }

      /* Now remove any spurious 'default' entries. */
      num_chunks = 0;
      for (i=0, inlist=outlist=new_list; i<old_num_chunks; ++i, inlist += 5)
      {
         if (inlist[4])
         {
            if (outlist != inlist)
               memcpy(outlist, inlist, 5);
            outlist += 5;
            ++num_chunks;
         }
      }

      /* This means the application has removed all the specialized handling. */
      if (num_chunks == 0)
      {
         if (png_ptr->chunk_list != new_list)
            png_free(png_ptr, new_list);

         new_list = NULL;
      }
   }

   else
      num_chunks = 0;

   png_ptr->num_chunk_list = num_chunks;

   if (png_ptr->chunk_list != new_list)
   {
      if (png_ptr->chunk_list != NULL)
         png_free(png_ptr, png_ptr->chunk_list);

      png_ptr->chunk_list = new_list;
   }
}